

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void Fl_X::activate_window(Window w)

{
  int iVar1;
  Fl_X *pFVar2;
  Fl_X *x;
  Window prev;
  Window w_local;
  
  iVar1 = ewmh_supported();
  if (iVar1 != 0) {
    x = (Fl_X *)0x0;
    if (fl_xfocus != (Fl_Window *)0x0) {
      pFVar2 = i(fl_xfocus);
      if (pFVar2 == (Fl_X *)0x0) {
        return;
      }
      x = (Fl_X *)pFVar2->xid;
    }
    send_wm_event(w,fl_NET_ACTIVE_WINDOW,1,0,(unsigned_long)x,0,0);
  }
  return;
}

Assistant:

void Fl_X::activate_window(Window w) {
  if (!ewmh_supported())
    return;

  Window prev = 0;

  if (fl_xfocus) {
    Fl_X *x = Fl_X::i(fl_xfocus);
    if (!x)
      return;
    prev = x->xid;
  }

  send_wm_event(w, fl_NET_ACTIVE_WINDOW, 1 /* application */,
                0 /* timestamp */, prev /* previously active window */);
}